

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void mon_lore(wchar_t oid)

{
  wchar_t wVar1;
  monster_race *race_00;
  monster_lore *original_lore;
  textblock *tb_00;
  textblock *tb;
  monster_lore *lore;
  monster_race *race;
  wchar_t r_idx;
  wchar_t oid_local;
  
  wVar1 = default_item_id(oid);
  if (wVar1 != L'\0') {
    race_00 = r_info + wVar1;
    original_lore = (monster_lore *)get_lore(race_00);
    monster_race_track(player->upkeep,race_00);
    handle_stuff(player);
    tb_00 = textblock_new();
    lore_description(tb_00,race_00,original_lore,false);
    textui_textblock_show(tb_00,(region)ZEXT816((ulong)0),(char *)0x0);
    textblock_free(tb_00);
    return;
  }
  __assert_fail("r_idx",
                "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/ui-knowledge.c"
                ,0x4c4,"void mon_lore(int)");
}

Assistant:

static void mon_lore(int oid)
{
	int r_idx;
	struct monster_race *race;
	const struct monster_lore *lore;
	textblock *tb;

	r_idx = default_item_id(oid);

	assert(r_idx);
	race = &r_info[r_idx];
	lore = get_lore(race);

	/* Update the monster recall window */
	monster_race_track(player->upkeep, race);
	handle_stuff(player);

	tb = textblock_new();
	lore_description(tb, race, lore, false);
	textui_textblock_show(tb, SCREEN_REGION, NULL);
	textblock_free(tb);
}